

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributesPrivate::operator==
          (ON_3dmObjectAttributesPrivate *this,ON_3dmObjectAttributesPrivate *other)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  ON_Linetype *customOther;
  ON_Linetype *customThis;
  ON_ModelComponentContentMark local_58;
  element_type *local_30;
  ON_SectionStyle *customOther_1;
  ON_SectionStyle *customThis_1;
  ON_3dmObjectAttributesPrivate *other_local;
  ON_3dmObjectAttributesPrivate *this_local;
  
  if (this->m_section_attributes_source == other->m_section_attributes_source) {
    if ((this->m_linetype_scale != other->m_linetype_scale) ||
       (NAN(this->m_linetype_scale) || NAN(other->m_linetype_scale))) {
      this_local._7_1_ = false;
    }
    else {
      customThis_1 = (ON_SectionStyle *)other;
      other_local = this;
      uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_hatch_background_fill);
      uVar3 = ON_Color::operator_cast_to_unsigned_int
                        ((ON_Color *)
                         &(customThis_1->super_ON_ModelComponent).m_runtime_serial_number);
      if (uVar2 == uVar3) {
        if ((this->m_hatch_boundary_visible & 1U) ==
            (*(byte *)((long)&(customThis_1->super_ON_ModelComponent).m_runtime_serial_number + 4) &
            1)) {
          if (this->m_section_label_style ==
              *(SectionLabelStyle *)
               ((long)&(customThis_1->super_ON_ModelComponent).m_runtime_serial_number + 5)) {
            customOther_1 =
                 std::__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->m_custom_section_style).
                             super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>);
            local_30 = std::__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>::get
                                 ((__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2> *)
                                  &(customThis_1->super_ON_ModelComponent).
                                   m_linked_idef_serial_number);
            if ((customOther_1 == (ON_SectionStyle *)0x0) && (local_30 != (element_type *)0x0)) {
              this_local._7_1_ = false;
            }
            else if ((customOther_1 == (ON_SectionStyle *)0x0) || (local_30 != (element_type *)0x0))
            {
              if ((customOther_1 != (ON_SectionStyle *)0x0) && (local_30 != (element_type *)0x0)) {
                ON_ModelComponentContentMark::ON_ModelComponentContentMark
                          (&local_58,&customOther_1->super_ON_ModelComponent);
                ON_ModelComponentContentMark::ON_ModelComponentContentMark
                          ((ON_ModelComponentContentMark *)&customThis,
                           &local_30->super_ON_ModelComponent);
                bVar1 = ::operator!=(&local_58,(ON_ModelComponentContentMark *)&customThis);
                if (bVar1) {
                  return false;
                }
              }
              peVar4 = std::__shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>::get
                                 (&(this->m_custom_linetype).
                                   super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>);
              peVar5 = std::__shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>::get
                                 ((__shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2> *)
                                  &(customThis_1->super_ON_ModelComponent).m_content_version_number)
              ;
              if (peVar4 == peVar5) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmObjectAttributesPrivate::operator==(const ON_3dmObjectAttributesPrivate& other) const
{
  if (m_section_attributes_source != other.m_section_attributes_source)
    return false;

  if (m_linetype_scale != other.m_linetype_scale)
    return false;

  if (m_hatch_background_fill != other.m_hatch_background_fill)
    return false;

  if (m_hatch_boundary_visible != other.m_hatch_boundary_visible)
    return false;

  if (m_section_label_style != other.m_section_label_style)
    return false;

  {
    const ON_SectionStyle* customThis = m_custom_section_style.get();
    const ON_SectionStyle* customOther = other.m_custom_section_style.get();
    if (nullptr == customThis && customOther)
      return false;
    if (customThis && nullptr == customOther)
      return false;
    if (customThis && customOther)
    {
      if ((*customThis) != (*customOther))
        return false;
    }
  }

  const ON_Linetype* customThis = m_custom_linetype.get();
  const ON_Linetype* customOther = other.m_custom_linetype.get();
  if (customThis != customOther)
    return false;

  return true;
}